

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_search.cpp
# Opt level: O2

void __thiscall LoopSearch::build_map(LoopSearch *this)

{
  Function *fun;
  Loop *pLVar1;
  mapped_type *ppLVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  BasicBlock *bb;
  map<BasicBlock_*,_Loop_*,_std::less<BasicBlock_*>,_std::allocator<std::pair<BasicBlock_*const,_Loop_*>_>_>
  _sub_map;
  BasicBlock *local_b8;
  _List_node_base *local_b0;
  _Rb_tree<BasicBlock_*,_std::pair<BasicBlock_*const,_Loop_*>,_std::_Select1st<std::pair<BasicBlock_*const,_Loop_*>_>,_std::less<BasicBlock_*>,_std::allocator<std::pair<BasicBlock_*const,_Loop_*>_>_>
  local_a8;
  _List_base<Function_*,_std::allocator<Function_*>_> local_78;
  _Rb_tree<Loop_*,_Loop_*,_std::_Identity<Loop_*>,_std::less<Loop_*>,_std::allocator<Loop_*>_>
  local_60;
  
  Module::get_functions_abi_cxx11_
            ((list<Function_*,_std::allocator<Function_*>_> *)&local_78,(this->super_Pass).m_);
  p_Var3 = (_List_node_base *)&local_78;
  while (p_Var3 = (((_List_base<Function_*,_std::allocator<Function_*>_> *)&p_Var3->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)&local_78) {
    fun = (Function *)p_Var3[1]._M_next;
    p_Var4 = (fun->basic_blocks_).super__List_base<BasicBlock_*,_std::allocator<BasicBlock_*>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    if (p_Var4 != (_List_node_base *)&fun->basic_blocks_) {
      local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_a8._M_impl.super__Rb_tree_header._M_header;
      local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_b0 = p_Var3;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
      for (; p_Var4 != (_List_node_base *)&fun->basic_blocks_; p_Var4 = p_Var4->_M_next) {
        local_b8 = (BasicBlock *)p_Var4[1]._M_next;
        get_loop((set<Loop_*,_std::less<Loop_*>,_std::allocator<Loop_*>_> *)&local_60,this,fun);
        pLVar1 = get_inner_loop(this,(set<Loop_*,_std::less<Loop_*>,_std::allocator<Loop_*>_> *)
                                     &local_60,local_b8);
        ppLVar2 = std::
                  map<BasicBlock_*,_Loop_*,_std::less<BasicBlock_*>,_std::allocator<std::pair<BasicBlock_*const,_Loop_*>_>_>
                  ::operator[]((map<BasicBlock_*,_Loop_*,_std::less<BasicBlock_*>,_std::allocator<std::pair<BasicBlock_*const,_Loop_*>_>_>
                                *)&local_a8,&local_b8);
        *ppLVar2 = pLVar1;
        std::
        _Rb_tree<Loop_*,_Loop_*,_std::_Identity<Loop_*>,_std::less<Loop_*>,_std::allocator<Loop_*>_>
        ::~_Rb_tree(&local_60);
      }
      std::
      _Rb_tree<BasicBlock_*,_std::pair<BasicBlock_*const,_Loop_*>,_std::_Select1st<std::pair<BasicBlock_*const,_Loop_*>_>,_std::less<BasicBlock_*>,_std::allocator<std::pair<BasicBlock_*const,_Loop_*>_>_>
      ::~_Rb_tree(&local_a8);
      p_Var3 = local_b0;
    }
  }
  std::__cxx11::_List_base<Function_*,_std::allocator<Function_*>_>::_M_clear(&local_78);
  return;
}

Assistant:

void LoopSearch::build_map() {
    for (auto f: m_->get_functions()) {
        if (f->is_declaration()) continue;
        std::map<BasicBlock *, Loop *> _sub_map;
        for (auto bb: f->get_basic_blocks()) {
            _sub_map[bb] = get_inner_loop(get_loop(f), bb);
        }
    }
}